

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool parse_number(cJSON *item,parse_buffer *input_buffer)

{
  long lVar1;
  uchar uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  double dVar5;
  ulong local_90;
  size_t i;
  uchar decimal_point;
  double number;
  parse_buffer *input_buffer_local;
  cJSON *item_local;
  uchar **local_60;
  uchar *after_end;
  uchar number_c_string [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = (uchar **)0x0;
  uVar2 = get_decimal_point();
  if ((input_buffer == (parse_buffer *)0x0) || (input_buffer->content == (uchar *)0x0)) {
    item_local._4_4_ = 0;
  }
  else {
    local_90 = 0;
    while( true ) {
      bVar4 = false;
      if ((local_90 < 0x3f) && (bVar4 = false, input_buffer != (parse_buffer *)0x0)) {
        bVar4 = input_buffer->offset + local_90 < input_buffer->length;
      }
      if (!bVar4) break;
      uVar3 = (uint)input_buffer->content[local_90 + input_buffer->offset];
      if ((uVar3 == 0x2b) || (uVar3 == 0x2d)) {
LAB_00105581:
        number_c_string[local_90 - 8] = input_buffer->content[local_90 + input_buffer->offset];
      }
      else {
        if (uVar3 != 0x2e) {
          if (((uVar3 - 0x30 < 10) || (uVar3 == 0x45)) || (uVar3 == 0x65)) goto LAB_00105581;
          break;
        }
        number_c_string[local_90 - 8] = uVar2;
      }
      local_90 = local_90 + 1;
    }
    number_c_string[local_90 - 8] = '\0';
    dVar5 = strtod((char *)&after_end,(char **)&local_60);
    if (&after_end == local_60) {
      item_local._4_4_ = 0;
    }
    else {
      item->valuedouble = dVar5;
      if (dVar5 < 2147483647.0) {
        if (-2147483648.0 < dVar5) {
          item->valueint = (int)dVar5;
        }
        else {
          item->valueint = -0x80000000;
        }
      }
      else {
        item->valueint = 0x7fffffff;
      }
      item->type = 8;
      input_buffer->offset = (long)local_60 + (input_buffer->offset - (long)&after_end);
      item_local._4_4_ = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool parse_number(cJSON * const item, parse_buffer * const input_buffer)
{
    double number = 0;
    unsigned char *after_end = NULL;
    unsigned char number_c_string[64];
    unsigned char decimal_point = get_decimal_point();
    size_t i = 0;

    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false;
    }

    /* copy the number into a temporary buffer and replace '.' with the decimal point
     * of the current locale (for strtod)
     * This also takes care of '\0' not necessarily being available for marking the end of the input */
    for (i = 0; (i < (sizeof(number_c_string) - 1)) && can_access_at_index(input_buffer, i); i++)
    {
        switch (buffer_at_offset(input_buffer)[i])
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '+':
            case '-':
            case 'e':
            case 'E':
                number_c_string[i] = buffer_at_offset(input_buffer)[i];
                break;

            case '.':
                number_c_string[i] = decimal_point;
                break;

            default:
                goto loop_end;
        }
    }
loop_end:
    number_c_string[i] = '\0';

    number = strtod((const char*)number_c_string, (char**)&after_end);
    if (number_c_string == after_end)
    {
        return false; /* parse_error */
    }

    item->valuedouble = number;

    /* use saturation in case of overflow */
    if (number >= INT_MAX)
    {
        item->valueint = INT_MAX;
    }
    else if (number <= INT_MIN)
    {
        item->valueint = INT_MIN;
    }
    else
    {
        item->valueint = (int)number;
    }

    item->type = cJSON_Number;

    input_buffer->offset += (size_t)(after_end - number_c_string);
    return true;
}